

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::HandleFilterCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string *var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  allocator local_69;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  uVar4 = lVar5 >> 5;
  if (uVar4 < 2) {
    std::__cxx11::string::string
              ((string *)&local_68,"sub-command FILTER requires a list to be specified.",
               (allocator *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&local_68);
LAB_002ffb23:
    std::__cxx11::string::~string((string *)&local_68);
    return false;
  }
  if (lVar5 == 0x40) {
    std::__cxx11::string::string
              ((string *)&local_68,"sub-command FILTER requires an operator to be specified.",
               (allocator *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    goto LAB_002ffb23;
  }
  if (uVar4 < 4) {
    std::__cxx11::string::string
              ((string *)&local_68,"sub-command FILTER requires a mode to be specified.",
               (allocator *)&local_48);
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    goto LAB_002ffb23;
  }
  var = pbVar1 + 1;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = GetList(this,&local_48,var);
  if (bVar2) {
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2;
    bVar2 = std::operator==(pbVar6,"INCLUDE");
    if ((bVar2) || (bVar3 = std::operator==(pbVar6,"EXCLUDE"), bVar3)) {
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3;
      bVar3 = std::operator==(pbVar6,"REGEX");
      if (bVar3) {
        if ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start == 0xa0) {
          bVar2 = FilterRegex(this,args,bVar2,var,&local_48);
          goto LAB_002ffc7c;
        }
        std::__cxx11::string::string
                  ((string *)&local_68,"sub-command FILTER, mode REGEX requires five arguments.",
                   &local_69);
        cmCommand::SetError(&this->super_cmCommand,&local_68);
      }
      else {
        std::operator+(&local_68,"sub-command FILTER does not recognize mode ",pbVar6);
        cmCommand::SetError(&this->super_cmCommand,&local_68);
      }
    }
    else {
      std::operator+(&local_68,"sub-command FILTER does not recognize operator ",pbVar6);
      cmCommand::SetError(&this->super_cmCommand,&local_68);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_68,"sub-command FILTER requires list to be present.",&local_69);
    cmCommand::SetError(&this->super_cmCommand,&local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  bVar2 = false;
LAB_002ffc7c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar2;
}

Assistant:

bool cmListCommand::HandleFilterCommand(std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command FILTER requires a list to be specified.");
    return false;
  }

  if (args.size() < 3) {
    this->SetError("sub-command FILTER requires an operator to be specified.");
    return false;
  }

  if (args.size() < 4) {
    this->SetError("sub-command FILTER requires a mode to be specified.");
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, listName)) {
    this->SetError("sub-command FILTER requires list to be present.");
    return false;
  }

  const std::string& op = args[2];
  bool includeMatches;
  if (op == "INCLUDE") {
    includeMatches = true;
  } else if (op == "EXCLUDE") {
    includeMatches = false;
  } else {
    this->SetError("sub-command FILTER does not recognize operator " + op);
    return false;
  }

  const std::string& mode = args[3];
  if (mode == "REGEX") {
    if (args.size() != 5) {
      this->SetError("sub-command FILTER, mode REGEX "
                     "requires five arguments.");
      return false;
    }
    return this->FilterRegex(args, includeMatches, listName, varArgsExpanded);
  }

  this->SetError("sub-command FILTER does not recognize mode " + mode);
  return false;
}